

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

NameSyntax * __thiscall
slang::parsing::Parser::parseNamePart
          (Parser *this,bitmask<slang::parsing::detail::NameOptions> options)

{
  BumpAllocator *alloc;
  pointer ppEVar1;
  bool bVar2;
  SyntaxKind kind;
  uint uVar3;
  int iVar4;
  ParameterValueAssignmentSyntax *parameters;
  IdentifierSelectNameSyntax *pIVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SourceLocation SVar6;
  undefined4 extraout_var_01;
  KeywordNameSyntax *pKVar7;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  Info *src_01;
  Info *extraout_RDX;
  Token TVar8;
  Token TVar9;
  uint32_t index;
  SmallVector<slang::syntax::ElementSelectSyntax_*,_5UL> buffer;
  Token local_c0;
  uint32_t local_ac;
  SmallVectorBase<slang::syntax::ElementSelectSyntax_*> local_a8 [2];
  SyntaxList<slang::syntax::ElementSelectSyntax> local_68;
  
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  kind = slang::syntax::SyntaxFacts::getKeywordNameExpression(TVar8.kind);
  if (kind != Unknown) {
    bVar2 = slang::syntax::SyntaxFacts::isSpecialMethodName(kind);
    if (bVar2) {
      if ((options.m_bits & 2) != 0) goto LAB_00665141;
    }
    else {
      if (kind == ConstructorName) {
        TVar9 = ParserBase::consume(&this->super_ParserBase);
        kind = ConstructorName;
        goto LAB_00665508;
      }
      if ((options.m_bits & 2) == 0) {
        if (kind == ThisHandle) {
          uVar3 = options.m_bits & 8;
        }
        else {
          if (kind != SuperHandle) goto LAB_00665141;
          uVar3 = options.m_bits & 0xc;
        }
        if (uVar3 == 0) goto LAB_00665141;
      }
    }
    TVar9 = ParserBase::consume(&this->super_ParserBase);
LAB_00665508:
    pKVar7 = slang::syntax::SyntaxFactory::keywordName(&this->factory,kind,TVar9);
    return &pKVar7->super_NameSyntax;
  }
LAB_00665141:
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  Token::Token(&local_c0);
  if ((TVar8.kind != Dot) && (uVar3 = TVar8._0_4_ & 0xffff, uVar3 != 0x17)) {
    if (uVar3 == 2) {
      local_c0 = ParserBase::consume(&this->super_ParserBase);
      goto LAB_006651e0;
    }
    if ((options.m_bits & 0x10) != 0) {
      bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar2) {
        local_a8[0]._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
        SVar6 = Token::location((Token *)local_a8);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar6);
      }
      alloc = (this->super_ParserBase).alloc;
      local_a8[0]._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      SVar6 = Token::location((Token *)local_a8);
      local_c0 = Token::createMissing(alloc,Identifier,SVar6);
      goto LAB_006651e0;
    }
  }
  local_c0 = ParserBase::expect(&this->super_ParserBase,Identifier);
LAB_006651e0:
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  if (TVar8.kind == OpenBracket) {
    ppEVar1 = (pointer)((long)local_a8 + 0x18);
    if ((options.m_bits & 1) == 0) {
      local_a8[0].len = 0;
      local_a8[0].data_ = ppEVar1;
      local_a8[0].cap = 5;
      do {
        if (((options.m_bits & 0x20) != 0) &&
           (bVar2 = isSequenceRepetition(this), TVar9 = local_c0, bVar2)) {
          if ((Info *)local_a8[0].len == (Info *)0x0) {
            pIVar5 = (IdentifierSelectNameSyntax *)
                     slang::syntax::SyntaxFactory::identifierName(&this->factory,local_c0);
          }
          else {
            iVar4 = SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::copy
                              (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
            local_68.super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>._M_ptr
                 = (pointer)CONCAT44(extraout_var_01,iVar4);
            local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
            local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
            local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
            local_68.super_SyntaxListBase._vptr_SyntaxListBase =
                 (_func_int **)&PTR_getChild_00c95618;
            pIVar5 = slang::syntax::SyntaxFactory::identifierSelectName
                               (&this->factory,TVar9,&local_68);
          }
          goto LAB_0066553a;
        }
        local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)parseElementSelect(this);
        SmallVectorBase<slang::syntax::ElementSelectSyntax*>::
        emplace_back<slang::syntax::ElementSelectSyntax*>
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax*> *)local_a8,
                   (ElementSelectSyntax **)&local_68);
        bVar2 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
        TVar9 = local_c0;
      } while (bVar2);
      iVar4 = SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::copy
                        (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
      local_68.super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>._M_ptr =
           (pointer)CONCAT44(extraout_var,iVar4);
      local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c95618;
      pIVar5 = slang::syntax::SyntaxFactory::identifierSelectName(&this->factory,TVar9,&local_68);
    }
    else {
      local_a8[0].len = 0;
      local_a8[0].data_ = ppEVar1;
      local_a8[0].cap = 5;
      do {
        local_ac = 1;
        scanTypePart<&slang::syntax::SyntaxFacts::isSemicolon>
                  (this,&local_ac,OpenBracket,CloseBracket);
        TVar8 = ParserBase::peek(&this->super_ParserBase,local_ac);
        if (TVar8.kind != OpenBracket) {
          TVar8 = ParserBase::peek(&this->super_ParserBase,local_ac);
          src_01 = TVar8.info;
          if (TVar8.kind != Dot) break;
        }
        local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)parseElementSelect(this);
        SmallVectorBase<slang::syntax::ElementSelectSyntax*>::
        emplace_back<slang::syntax::ElementSelectSyntax*>
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax*> *)local_a8,
                   (ElementSelectSyntax **)&local_68);
        bVar2 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
        src_01 = extraout_RDX;
      } while (bVar2);
      TVar9 = local_c0;
      if ((Info *)local_a8[0].len == (Info *)0x0) {
        pIVar5 = (IdentifierSelectNameSyntax *)
                 slang::syntax::SyntaxFactory::identifierName(&this->factory,local_c0);
      }
      else {
        iVar4 = SmallVectorBase<slang::syntax::ElementSelectSyntax_*>::copy
                          (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                           (EVP_PKEY_CTX *)src_01);
        local_68.super_span<slang::syntax::ElementSelectSyntax_*,_18446744073709551615UL>._M_ptr =
             (pointer)CONCAT44(extraout_var_00,iVar4);
        local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
        local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c95618;
        pIVar5 = slang::syntax::SyntaxFactory::identifierSelectName(&this->factory,TVar9,&local_68);
      }
    }
LAB_0066553a:
    if (local_a8[0].data_ != ppEVar1) {
      operator_delete(local_a8[0].data_);
    }
  }
  else if ((TVar8.kind == Hash) && ((options.m_bits & 0x40) == 0)) {
    parameters = parseParameterValueAssignment(this);
    pIVar5 = (IdentifierSelectNameSyntax *)
             slang::syntax::SyntaxFactory::className(&this->factory,local_c0,parameters);
  }
  else {
    pIVar5 = (IdentifierSelectNameSyntax *)
             slang::syntax::SyntaxFactory::identifierName(&this->factory,local_c0);
  }
  return &pIVar5->super_NameSyntax;
}

Assistant:

NameSyntax& Parser::parseNamePart(bitmask<NameOptions> options) {
    auto kind = getKeywordNameExpression(peek().kind);
    if (kind != SyntaxKind::Unknown) {
        // This is a keyword name such as "super", "xor", or "new".
        bool isFirst = (options & NameOptions::IsFirst) != 0;
        if (isSpecialMethodName(kind)) {
            // The built-in methods ("xor", "unique", etc) and are not allowed
            // to be the first element in the name.
            if (!isFirst)
                return factory.keywordName(kind, consume());
        }
        else if (kind == SyntaxKind::ConstructorName) {
            // "new" names are always allowed.
            return factory.keywordName(kind, consume());
        }
        else {
            // Otherwise this is "$unit", "$root", "local", "this", "super".
            // These are only allowed to be the first element in a path, except
            // for "super" which can follow "this".
            if (isFirst ||
                (kind == SyntaxKind::SuperHandle && options.has(NameOptions::PreviousWasThis)) ||
                ((kind == SyntaxKind::SuperHandle || kind == SyntaxKind::ThisHandle) &&
                 options.has(NameOptions::PreviousWasLocal))) {
                return factory.keywordName(kind, consume());
            }
        }

        // Otherwise fall through to the handling below to get an error emitted.
    }

    TokenKind next = peek().kind;
    Token identifier;
    if (next == TokenKind::Identifier) {
        identifier = consume();
    }
    else if (next != TokenKind::Dot && next != TokenKind::DoubleColon &&
             options.has(NameOptions::ExpectingExpression)) {
        if (!haveDiagAtCurrentLoc())
            addDiag(diag::ExpectedExpression, peek().location());
        identifier = Token::createMissing(alloc, TokenKind::Identifier, peek().location());
    }
    else {
        identifier = expect(TokenKind::Identifier);
    }

    switch (peek().kind) {
        case TokenKind::Hash: {
            if (options.has(NameOptions::NoClassScope))
                return factory.identifierName(identifier);

            auto parameterValues = parseParameterValueAssignment();
            SLANG_ASSERT(parameterValues);
            return factory.className(identifier, *parameterValues);
        }
        case TokenKind::OpenBracket: {
            if (options.has(NameOptions::ForeachName)) {
                // For a foreach loop declaration, the final selector
                // brackets need to be parsed specially because they declare
                // loop variable names. All the selectors prior can be
                // parsed as normal selectors.
                SmallVector<ElementSelectSyntax*> buffer;
                do {
                    uint32_t index = 1;
                    scanTypePart<isSemicolon>(index, TokenKind::OpenBracket,
                                              TokenKind::CloseBracket);
                    if (peek(index).kind != TokenKind::OpenBracket &&
                        peek(index).kind != TokenKind::Dot) {
                        break;
                    }

                    buffer.push_back(&parseElementSelect());
                } while (peek(TokenKind::OpenBracket));

                if (buffer.empty())
                    return factory.identifierName(identifier);

                return factory.identifierSelectName(identifier, buffer.copy(alloc));
            }
            else {
                SmallVector<ElementSelectSyntax*> buffer;
                do {
                    // Inside a sequence expression this could be a repetition directive
                    // instead of a selection.
                    if (options.has(NameOptions::SequenceExpr) && isSequenceRepetition()) {
                        if (buffer.empty())
                            return factory.identifierName(identifier);
                        else
                            return factory.identifierSelectName(identifier, buffer.copy(alloc));
                    }

                    buffer.push_back(&parseElementSelect());
                } while (peek(TokenKind::OpenBracket));

                return factory.identifierSelectName(identifier, buffer.copy(alloc));
            }
        }
        default: {
            return factory.identifierName(identifier);
        }
    }
}